

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketInitiator::~ThreadedSocketInitiator(ThreadedSocketInitiator *this)

{
  _Manager_type p_Var1;
  
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__ThreadedSocketInitiator_001fa7a8;
  socket_term();
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_mutex);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_threads)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>_>
  ::~_Rb_tree(&(this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t);
  p_Var1 = (this->m_hostDetailsProvider).getTime.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_hostDetailsProvider,(_Any_data *)&this->m_hostDetailsProvider,
              __destroy_functor);
  }
  Dictionary::~Dictionary(&(this->m_settings).m_defaults);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)&this->m_settings);
  Initiator::~Initiator(&this->super_Initiator);
  return;
}

Assistant:

ThreadedSocketInitiator::~ThreadedSocketInitiator() { socket_term(); }